

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRange.h
# Opt level: O0

void __thiscall
RangeIterators::
FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:36:3)>
::SatisfyPredicate(FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
                   *this)

{
  bool bVar1;
  reference piVar2;
  byte local_19;
  FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
  *this_local;
  
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&this->Cur,&this->End);
    local_19 = 0;
    if (bVar1) {
      piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&this->Cur);
      bVar1 = anon_class_1_0_00000001_for_Pred::operator()
                        ((anon_class_1_0_00000001_for_Pred *)&this->field_0x10,*piVar2);
      local_19 = bVar1 ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&this->Cur);
  }
  return;
}

Assistant:

void SatisfyPredicate()
  {
    while (this->Cur != this->End && !this->Pred(*this->Cur)) {
      ++this->Cur;
    }
  }